

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,2,false>,Eigen::Matrix<double,2,1,0,2,1>,1>,Eigen::internal::assign_op<double,double>>
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,
               Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
               *src,assign_op<double,_double> *func)

{
  Index func_00;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dstExpr;
  undefined1 local_100 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_b8 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
  *src_local;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst_local;
  
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = (Index)func;
  evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>
  ::evaluator((evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>
               *)local_b8,src);
  resize_if_allowed<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,2,false>,Eigen::Matrix<double,2,1,0,2,1>,1>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_innerDim);
  evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::evaluator
            ((evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_innerDim;
  dstExpr = EigenBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            ::const_cast_derived
                      ((EigenBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_100,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_b8,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_100);
  evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  ~evaluator((evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&kernel.m_dstExpr);
  evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>
  ::~evaluator((evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>
                *)local_b8);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}